

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

offset_t __thiscall ser::OffsetTable::GetOffset(OffsetTable *this,int savepointID,string *fieldName)

{
  pointer pmVar1;
  const_iterator cVar2;
  ostream *poVar3;
  SerializationException *pSVar4;
  SerializationException exception;
  string local_1c8 [32];
  ostringstream msg;
  
  pmVar1 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->entries_).
                     super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1) / 0x30) <=
      (ulong)(uint)savepointID) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar3 = std::operator<<((ostream *)&msg,"Error: savepoint with ID ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,savepointID);
    poVar3 = std::operator<<(poVar3," is not registered in table\n");
    poVar3 = std::operator<<(poVar3,"Retrieving the offset of the field ");
    poVar3 = std::operator<<(poVar3,(string *)fieldName);
    std::operator<<(poVar3," is not possible\n");
    exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
    exception._0_8_ = &PTR__SerializationException_0013e790;
    exception.message_._M_string_length = 0;
    exception.message_.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&exception.message_);
    std::__cxx11::string::~string(local_1c8);
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,&exception);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
          ::find(&pmVar1[savepointID]._M_t,fieldName);
  if (cVar2._M_node != &pmVar1[savepointID]._M_t._M_impl.super__Rb_tree_header._M_header) {
    return *(offset_t *)(cVar2._M_node + 2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar3 = std::operator<<((ostream *)&msg,"Error: field ");
  poVar3 = std::operator<<(poVar3,(string *)fieldName);
  poVar3 = std::operator<<(poVar3," is not registered at the savepoint ");
  Savepoint::ToString_abi_cxx11_
            ((string *)&exception,
             (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
             ._M_impl.super__Vector_impl_data._M_start + savepointID);
  poVar3 = std::operator<<(poVar3,(string *)&exception);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_0013e790;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  std::__cxx11::string::~string(local_1c8);
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,&exception);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(int savepointID, const std::string& fieldName) const
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check that field is saved at savepoint
    const OffsetTableEntry& entry = entries_[savepointID];
    const_iterator iter = entry.find(fieldName);
    if (iter == entry.end())
    {
        std::ostringstream msg;
        msg << "Error: field " << fieldName << " is not registered at the savepoint "
            << savepoints_[savepointID].ToString() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Return offset
    return iter->second.offset;
}